

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStream_EndProcessing(PaAlsaStream *self,unsigned_long numFrames,int *xrunOccurred)

{
  uint uVar1;
  snd_pcm_channel_area_t *psVar2;
  snd_pcm_uframes_t sVar3;
  int iVar4;
  int iVar5;
  pthread_t __thread1;
  byte bVar6;
  PaError PVar7;
  size_t __n;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  char *pcVar11;
  void *__s;
  int xrun;
  int local_4c;
  ulong local_48;
  int *local_40;
  undefined8 local_38;
  
  xrun = 0;
  if (((self->capture).pcm == (snd_pcm_t *)0x0) ||
     (paUtilErr_ = PaAlsaStreamComponent_EndProcessing(&self->capture,numFrames,&xrun),
     -1 < paUtilErr_)) {
    PVar7 = 0;
    if ((self->playback).pcm == (snd_pcm_t *)0x0) goto LAB_00111396;
    uVar1 = (self->playback).numHostChannels;
    iVar4 = (self->playback).numUserChannels;
    if (iVar4 < (int)uVar1) {
      iVar8 = uVar1 - iVar4;
      bVar6 = (byte)iVar4 & (uVar1 & 1) == 0;
      local_48 = numFrames;
      if ((self->playback).hostInterleaved == 0) {
        if (bVar6 != 0) {
          psVar2 = (self->playback).channelAreas;
          sVar3 = (self->playback).offset;
          iVar4 = snd_pcm_area_copy(psVar2 + iVar4,sVar3,psVar2 + (long)iVar4 + -1,sVar3,
                                    numFrames & 0xffffffff,(self->playback).nativeFormat);
          if (iVar4 < 0) {
            __thread1 = pthread_self();
            iVar8 = pthread_equal(__thread1,paUnixMainThread);
            if (iVar8 != 0) {
              pcVar11 = (char *)snd_strerror(iVar4);
              PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar4,pcVar11);
            }
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_pcm_area_copy( self->channelAreas + self->numUserChannels, self->offset, self->channelAreas + ( self->numUserChannels - 1 ), self->offset, numFrames, self->nativeFormat )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3567\n"
                             );
            paUtilErr_ = -9999;
            pcVar11 = 
            "Expression \'PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3594\n"
            ;
            goto LAB_001113bf;
          }
          iVar8 = iVar8 + -1;
        }
        if (0 < iVar8) {
          snd_pcm_areas_silence
                    ((self->playback).channelAreas +
                     ((long)(self->playback).numHostChannels - (long)iVar8),(self->playback).offset,
                     iVar8,(long)(int)local_48,(self->playback).nativeFormat);
        }
      }
      else {
        local_4c = iVar8;
        local_38 = snd_pcm_format_size((self->playback).nativeFormat);
        if ((self->playback).canMmap == 0) {
          pvVar9 = (self->playback).nonMmapBuffer;
        }
        else {
          psVar2 = (self->playback).channelAreas;
          pvVar9 = (void *)(((ulong)psVar2->step * (self->playback).offset + (ulong)psVar2->first >>
                            3) + (long)psVar2->addr);
        }
        iVar4 = (self->playback).numUserChannels;
        iVar5 = (int)local_38;
        __s = (void *)((long)(iVar4 * iVar5) + (long)pvVar9);
        iVar8 = local_4c;
        if (bVar6 != 0) {
          pvVar9 = (void *)((long)pvVar9 + (long)((iVar4 + -1) * iVar5));
          __n = (size_t)iVar5;
          uVar10 = 0;
          local_40 = xrunOccurred;
          if (0 < (int)local_48) {
            uVar10 = local_48 & 0xffffffff;
          }
          while (iVar4 = (int)uVar10, uVar10 = (ulong)(iVar4 - 1), iVar4 != 0) {
            memcpy((void *)(__n + (long)pvVar9),pvVar9,__n);
            pvVar9 = (void *)((long)pvVar9 + (long)(self->playback).numHostChannels * (long)iVar5);
          }
          __s = (void *)((long)__s + __n);
          xrunOccurred = local_40;
          iVar8 = local_4c + -1;
        }
        if (0 < iVar8) {
          iVar8 = iVar8 * (int)local_38;
          uVar10 = 0;
          if (0 < (int)local_48) {
            uVar10 = local_48 & 0xffffffff;
          }
          while (iVar4 = (int)uVar10, uVar10 = (ulong)(iVar4 - 1), iVar4 != 0) {
            memset(__s,0,(long)iVar8);
            __s = (void *)((long)__s + (long)(self->playback).numHostChannels * (long)iVar5);
          }
        }
      }
      paUtilErr_ = 0;
      numFrames = local_48;
    }
    paUtilErr_ = PaAlsaStreamComponent_EndProcessing(&self->playback,numFrames,&xrun);
    PVar7 = 0;
    if (-1 < paUtilErr_) goto LAB_00111396;
    pcVar11 = 
    "Expression \'PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3596\n"
    ;
  }
  else {
    pcVar11 = 
    "Expression \'PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3588\n"
    ;
  }
LAB_001113bf:
  PaUtil_DebugPrint(pcVar11);
  PVar7 = paUtilErr_;
LAB_00111396:
  *xrunOccurred = xrun;
  return PVar7;
}

Assistant:

static PaError PaAlsaStream_EndProcessing( PaAlsaStream *self, unsigned long numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    int xrun = 0;

    if( self->capture.pcm )
    {
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun ) );
    }
    if( self->playback.pcm )
    {
        if( self->playback.numHostChannels > self->playback.numUserChannels )
        {
            PA_ENSURE( PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames ) );
        }
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun ) );
    }

error:
    *xrunOccurred = xrun;
    return result;
}